

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cpp
# Opt level: O2

int __thiscall MeCab::Dictionary::open(Dictionary *this,char *__file,int __oflag,...)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Mmap<char> *pMVar4;
  ulong uVar5;
  uint *puVar6;
  int iVar7;
  Token *pTVar8;
  ostream *poVar9;
  char *pcVar10;
  char *r;
  wlog wStack_38;
  
  close(this,(int)__file);
  std::__cxx11::string::assign((char *)&this->filename_);
  iVar7 = Mmap<char>::open((this->dmmap_).ptr_,__file,__oflag);
  if ((char)iVar7 == '\0') {
    wlog::wlog(&wStack_38,&this->what_);
    poVar9 = std::operator<<((ostream *)&this->what_,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar9 = std::operator<<(poVar9,"(");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x4f);
    poVar9 = std::operator<<(poVar9,") [");
    poVar9 = std::operator<<(poVar9,"dmmap_->open(file, mode)");
    poVar9 = std::operator<<(poVar9,"] ");
    pcVar10 = "no such file or directory: ";
  }
  else {
    pMVar4 = (this->dmmap_).ptr_;
    uVar5 = pMVar4->length;
    if (uVar5 < 100) {
      wlog::wlog(&wStack_38,&this->what_);
      poVar9 = std::operator<<((ostream *)&this->what_,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                              );
      poVar9 = std::operator<<(poVar9,"(");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x52);
      poVar9 = std::operator<<(poVar9,") [");
      pcVar10 = "dmmap_->size() >= 100";
    }
    else {
      puVar6 = (uint *)pMVar4->text;
      if (uVar5 == ((ulong)*puVar6 ^ 0xef718f77)) {
        uVar1 = puVar6[1];
        this->version_ = uVar1;
        if (uVar1 != 0x66) {
          wlog::wlog(&wStack_38,&this->what_);
          poVar9 = std::operator<<((ostream *)&this->what_,
                                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                  );
          poVar9 = std::operator<<(poVar9,"(");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x62);
          poVar9 = std::operator<<(poVar9,") [");
          poVar9 = std::operator<<(poVar9,"version_ == DIC_VERSION");
          poVar9 = std::operator<<(poVar9,"] ");
          poVar9 = std::operator<<(poVar9,"incompatible version: ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          return 0;
        }
        this->type_ = puVar6[2];
        this->lexsize_ = puVar6[3];
        this->lsize_ = puVar6[4];
        this->rsize_ = puVar6[5];
        uVar1 = puVar6[6];
        uVar2 = puVar6[7];
        uVar3 = puVar6[8];
        this->charset_ = (char *)(puVar6 + 10);
        Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>
        ::set_array(&this->da_,puVar6 + 0x12,0);
        pTVar8 = (Token *)((long)puVar6 + (ulong)uVar1 + 0x48);
        this->token_ = pTVar8;
        pcVar10 = (char *)((long)&pTVar8->lcAttr + (ulong)uVar2);
        this->feature_ = pcVar10;
        pMVar4 = (this->dmmap_).ptr_;
        if (pcVar10 + uVar3 == pMVar4->text + pMVar4->length) {
          return (int)CONCAT71((int7)((ulong)pMVar4 >> 8),1);
        }
        wlog::wlog(&wStack_38,&this->what_);
        poVar9 = std::operator<<((ostream *)&this->what_,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                );
        poVar9 = std::operator<<(poVar9,"(");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x7a);
        poVar9 = std::operator<<(poVar9,") [");
        pcVar10 = "ptr == dmmap_->end()";
      }
      else {
        wlog::wlog(&wStack_38,&this->what_);
        poVar9 = std::operator<<((ostream *)&this->what_,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                );
        poVar9 = std::operator<<(poVar9,"(");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x5e);
        poVar9 = std::operator<<(poVar9,") [");
        pcVar10 = "(magic ^ DictionaryMagicID) == dmmap_->size()";
      }
    }
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9,"] ");
    pcVar10 = "dictionary file is broken: ";
  }
  poVar9 = std::operator<<(poVar9,pcVar10);
  std::operator<<(poVar9,__file);
  return 0;
}

Assistant:

bool Dictionary::open(const char *file, const char *mode) {
  close();
  filename_.assign(file);
  CHECK_FALSE(dmmap_->open(file, mode))
      << "no such file or directory: " << file;

  CHECK_FALSE(dmmap_->size() >= 100)
      << "dictionary file is broken: " << file;

  const char *ptr = dmmap_->begin();

  unsigned int dsize;
  unsigned int tsize;
  unsigned int fsize;
  unsigned int magic;
  unsigned int dummy;

  read_static<unsigned int>(&ptr, magic);
  CHECK_FALSE((magic ^ DictionaryMagicID) == dmmap_->size())
      << "dictionary file is broken: " << file;

  read_static<unsigned int>(&ptr, version_);
  CHECK_FALSE(version_ == DIC_VERSION)
      << "incompatible version: " << version_;

  read_static<unsigned int>(&ptr, type_);
  read_static<unsigned int>(&ptr, lexsize_);
  read_static<unsigned int>(&ptr, lsize_);
  read_static<unsigned int>(&ptr, rsize_);
  read_static<unsigned int>(&ptr, dsize);
  read_static<unsigned int>(&ptr, tsize);
  read_static<unsigned int>(&ptr, fsize);
  read_static<unsigned int>(&ptr, dummy);

  charset_ = ptr;
  ptr += 32;
  da_.set_array(reinterpret_cast<void *>(const_cast<char*>(ptr)));

  ptr += dsize;

  token_ = reinterpret_cast<const Token *>(ptr);
  ptr += tsize;

  feature_ = ptr;
  ptr += fsize;

  CHECK_FALSE(ptr == dmmap_->end())
      << "dictionary file is broken: " << file;

  return true;
}